

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O3

vector<hta::Row,_std::allocator<hta::Row>_> * __thiscall
hta::Metric::retrieve
          (vector<hta::Row,_std::allocator<hta::Row>_> *__return_storage_ptr__,Metric *this,
          TimePoint begin,TimePoint end,Duration interval_upper_limit,IntervalScope scope)

{
  pointer pTVar1;
  rep rVar2;
  duration dVar3;
  variant_alternative_t<1UL,_variant<vector<Row,_allocator<Row>_>,_vector<TimeValue,_allocator<TimeValue>_>_>_>
  *pvVar4;
  Duration active_time;
  pointer pTVar5;
  TimeValue tv;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_98;
  Value VStack_90;
  _Variadic_union<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
  local_88;
  byte local_70;
  duration<long,_std::ratio<1L,_1000000000L>_> local_68;
  Aggregate local_60;
  
  retrieve_flex((variant<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                 *)&local_88._M_first,this,begin,end,interval_upper_limit,scope,false);
  if (local_70 == 0) {
    (__return_storage_ptr__->super__Vector_base<hta::Row,_std::allocator<hta::Row>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_88._0_8_;
    (__return_storage_ptr__->super__Vector_base<hta::Row,_std::allocator<hta::Row>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_88._8_8_;
    (__return_storage_ptr__->super__Vector_base<hta::Row,_std::allocator<hta::Row>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_88._16_8_;
    local_88._0_8_ = (pointer)0x0;
    local_88._8_8_ = (pointer)0x0;
    local_88._16_8_ = (pointer)0x0;
  }
  else {
    pvVar4 = std::
             get<1ul,std::vector<hta::Row,std::allocator<hta::Row>>,std::vector<hta::TimeValue,std::allocator<hta::TimeValue>>>
                       ((variant<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                         *)&local_88._M_first);
    (__return_storage_ptr__->super__Vector_base<hta::Row,_std::allocator<hta::Row>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<hta::Row,_std::allocator<hta::Row>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<hta::Row,_std::allocator<hta::Row>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pTVar5 = (pvVar4->super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pTVar1 = (pvVar4->super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pTVar5 != pTVar1) {
      rVar2 = (pTVar5->time).
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r;
      std::vector<hta::Row,_std::allocator<hta::Row>_>::reserve
                (__return_storage_ptr__,(long)pTVar1 - (long)pTVar5 >> 4);
      pTVar5 = (pvVar4->super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>)._M_impl
               .super__Vector_impl_data._M_start;
      pTVar1 = (pvVar4->super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>)._M_impl
               .super__Vector_impl_data._M_finish;
      if (pTVar5 != pTVar1) {
        local_98.__d.__r = (duration)(duration)rVar2;
        do {
          dVar3.__r = (pTVar5->time).
                      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      .__d.__r;
          VStack_90 = pTVar5->value;
          local_68.__r = 0;
          active_time.__r = dVar3.__r - (long)local_98.__d.__r;
          local_98.__d.__r = (duration)(duration)dVar3.__r;
          Aggregate::Aggregate(&local_60,VStack_90,active_time);
          std::vector<hta::Row,std::allocator<hta::Row>>::
          emplace_back<std::chrono::duration<long,std::ratio<1l,1000000000l>>,hta::Clock::time_point&,hta::Aggregate>
                    ((vector<hta::Row,std::allocator<hta::Row>> *)__return_storage_ptr__,&local_68,
                     (time_point *)&local_98,&local_60);
          pTVar5 = pTVar5 + 1;
        } while (pTVar5 != pTVar1);
      }
    }
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>_&>
    ::_S_vtable._M_arr[local_70]._M_data)
            ((anon_class_1_0_00000001 *)&local_60,
             (variant<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
              *)&local_88._M_first);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Row> Metric::retrieve(TimePoint begin, TimePoint end, Duration interval_upper_limit,
                                  IntervalScope scope)
{
    auto flex = retrieve_flex(begin, end, interval_upper_limit, scope, false);
    if (auto pro = std::get_if<std::vector<Row>>(&flex))
    {
        // TODO check if that is correct
        // TODO check if that is actually efficient, i.e., zero-copy
        return std::move(*pro);
    }
    const auto& result_tv = std::get<std::vector<TimeValue>>(flex);
    std::vector<Row> result;
    if (result_tv.empty())
    {
        return result;
    }
    auto previous_timestamp = result_tv[0].time;
    result.reserve(result_tv.size());
    for (auto tv : result_tv)
    {
        result.emplace_back(Duration(0), tv.time,
                            Aggregate(tv.value, tv.time - previous_timestamp));
        previous_timestamp = tv.time;
    }
    return result;
}